

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[7],kj::Array<unsigned_char>&>
          (String *__return_storage_ptr__,kj *this,char (*params) [7],Array<unsigned_char> *params_1
          )

{
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  char *local_38;
  undefined8 local_30;
  Array<kj::CappedArray<char,_5UL>_> local_28;
  
  local_58 = toCharSequence<char_const(&)[7]>((char (*) [7])this);
  local_48.ptr = *(char **)params;
  local_48.size_ = *(size_t *)(params[1] + 1);
  local_38 = ", ";
  local_30 = 3;
  local_28.ptr = (CappedArray<char,_5UL> *)0x0;
  local_28.size_ = 0;
  local_28.disposer = (ArrayDisposer *)0x0;
  _::concat<kj::ArrayPtr<char_const>,kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
            (__return_storage_ptr__,(_ *)&local_58,&local_48,
             (Delimited<kj::ArrayPtr<const_unsigned_char>_> *)params_1);
  Array<kj::CappedArray<char,_5UL>_>::~Array(&local_28);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}